

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeValue>::File
          (File<hta::storage::file::Metric::Header,_hta::TimeValue> *this,Header *param_2,
          Header *param_3)

{
  _Ios_Openmode _Var1;
  streamoff sVar2;
  fpos<__mbstate_t> local_58;
  fpos local_48 [32];
  Header *local_28;
  Header *header_local;
  path *filename_local;
  File<hta::storage::file::Metric::Header,_hta::TimeValue> *this_local;
  
  local_28 = param_3;
  header_local = param_2;
  filename_local = &this->filename_;
  _Var1 = std::operator|(_S_in,_S_out);
  _Var1 = std::operator|(_Var1,_S_app);
  File(this,(path *)param_2,_Var1);
  std::ostream::seekp((long)&this->field_0x38,_S_beg);
  check_stream(this,"seekp to end");
  local_48._0_16_ = std::ostream::tellp();
  sVar2 = std::fpos::operator_cast_to_long(local_48);
  if (sVar2 == 0) {
    write_preamble(this,local_28);
  }
  else {
    std::fpos<__mbstate_t>::fpos(&local_58,0);
    std::istream::seekg(&this->stream_,local_58._M_off,local_58._M_state);
    check_stream(this,"seekg to begin");
    read_preamble(this);
  }
  check_size(this);
  return;
}

Assistant:

File(FileOpenTag::ReadWrite, const std::filesystem::path& filename, const HeaderType& header)
    : File(filename, std::ios_base::in | std::ios_base::out | std::ios_base::app)
    {
        // We need to use append mode otherwise it won't use O_CREAT.
        // Meanwhile app doesn't event seek to the end... oh my.
        stream_.seekp(0, std::fstream::end);
        check_stream("seekp to end");
        if (stream_.tellp() == 0)
        {
            write_preamble(header);
        }
        else
        {
            stream_.seekg(0);
            check_stream("seekg to begin");
            read_preamble();
            // TODO check compatibility of headers.
        }
        check_size();
    }